

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::udp_tracker_connection::fail
          (udp_tracker_connection *this,error_code *ec,operation_t op,char *msg,seconds32 interval,
          seconds32 min_interval)

{
  endpoint *this_00;
  mutex *pmVar1;
  ushort uVar2;
  int read_timeout;
  pointer pbVar3;
  pointer pbVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer pcVar6;
  session_settings *psVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char cVar10;
  __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  __dest;
  basic_endpoint<boost::asio::ip::tcp> *pbVar11;
  basic_endpoint<boost::asio::ip::tcp> *pbVar12;
  endpoint *ep;
  endpoint *ep_00;
  int completion_timeout;
  basic_endpoint<boost::asio::ip::tcp> *__src;
  ulong uVar13;
  shared_ptr<libtorrent::aux::request_callback> cb;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_a8 [2];
  seconds32 local_88;
  seconds32 local_84;
  error_code *local_80;
  undefined1 local_78 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined1 local_50 [32];
  
  pbVar3 = (this->m_endpoints).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->m_endpoints).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b8[0] = (this->m_target).impl_.data_.base.sa_family != 2;
  if ((bool)local_b8[0]) {
    local_b8._8_8_ = *(undefined8 *)((long)&(this->m_target).impl_.data_ + 8);
    aaStack_a8[0]._0_8_ = *(size_type *)((long)&(this->m_target).impl_.data_ + 0x10);
    aaStack_a8[0]._8_8_ = ZEXT48((this->m_target).impl_.data_.v6.sin6_scope_id);
    local_b8._4_4_ = 0;
  }
  else {
    local_b8._4_4_ = (this->m_target).impl_.data_.v6.sin6_flowinfo;
    local_b8._8_8_ = 0;
    aaStack_a8[0]._M_allocated_capacity = 0;
    aaStack_a8[0]._8_8_ = 0;
  }
  local_b8._1_3_ = 0;
  uVar2 = (this->m_target).impl_.data_.v4.sin_port;
  local_88.__r = interval.__r;
  local_84.__r = min_interval.__r;
  local_80 = ec;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)local_50,(address *)local_b8,
             uVar2 << 8 | uVar2 >> 8);
  __dest = ::std::
           __find_if<__gnu_cxx::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>>,__gnu_cxx::__ops::_Iter_equals_val<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const>>
                     (pbVar3,pbVar4,(basic_endpoint<boost::asio::ip::tcp> *)local_50);
  pbVar11 = (this->m_endpoints).
            super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar12 = (this->m_endpoints).
            super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != pbVar12) {
    __src = __dest._M_current + 1;
    if ((__src != pbVar12) && (uVar13 = (long)pbVar12 - (long)__src, 0 < (long)uVar13)) {
      memmove(__dest._M_current,__src,((uVar13 / 0x1c - 1) + (ulong)(uVar13 < 0x1c)) * 0x1c + 0x1c);
      pbVar11 = (this->m_endpoints).
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar12 = (this->m_endpoints).
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    __dest._M_current = pbVar12 + -1;
    (this->m_endpoints).
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = __dest._M_current;
  }
  if (((pbVar11 == __dest._M_current) ||
      (p_Var5 = (this->super_tracker_connection).m_req.outgoing_socket.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi, p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
     || (p_Var5->_M_use_count == 0)) {
    tracker_connection::fail(&this->super_tracker_connection,local_80,op,msg,local_88,local_84);
  }
  else {
    this_00 = &this->m_target;
    tracker_connection::requester((tracker_connection *)local_78);
    if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
      cVar10 = (**(code **)(*(_func_int **)local_78._0_8_ + 0x30))();
      uVar9 = local_78._0_8_;
      if (cVar10 != '\0') {
        pcVar6 = (this->m_hostname)._M_dataplus._M_p;
        print_endpoint_abi_cxx11_((string *)local_b8,(aux *)this_00,ep);
        uVar8 = local_b8._0_8_;
        (*local_80->cat_->_vptr_error_category[4])
                  (local_50,local_80->cat_,(ulong)(uint)local_80->val_);
        (**(code **)(*(_func_int **)uVar9 + 0x38))
                  (uVar9,"*** UDP_TRACKER [ host: \"%s\" ip: \"%s\" | ERROR: \"%s\" ]",pcVar6,uVar8,
                   local_50._0_8_);
        if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
          operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ != aaStack_a8) {
          operator_delete((void *)local_b8._0_8_,aaStack_a8[0]._M_allocated_capacity + 1);
        }
      }
    }
    pbVar3 = (this->m_endpoints).
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b8[0] = (pbVar3->impl_).data_.base.sa_family != 2;
    if ((bool)local_b8[0]) {
      local_b8._8_8_ = *(undefined8 *)((long)&(pbVar3->impl_).data_ + 8);
      aaStack_a8[0]._0_8_ = *(undefined8 *)((long)&(pbVar3->impl_).data_ + 0x10);
      aaStack_a8[0]._8_8_ = ZEXT48((pbVar3->impl_).data_.v6.sin6_scope_id);
      local_b8._4_4_ = 0;
    }
    else {
      local_b8._4_4_ = (pbVar3->impl_).data_.v6.sin6_flowinfo;
      local_b8._8_8_ = 0;
      aaStack_a8[0]._M_allocated_capacity = (undefined8 *)0x0;
      aaStack_a8[0]._8_8_ = 0;
    }
    local_b8._1_3_ = 0;
    uVar2 = (pbVar3->impl_).data_.v4.sin_port;
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::udp> *)local_50,(address *)local_b8,
               uVar2 << 8 | uVar2 >> 8);
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0xc) = local_50._12_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0x10) = local_50._16_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0x14) = local_50._20_4_;
    (this->m_target).impl_.data_.v6.sin6_scope_id = local_50._24_4_;
    *(undefined4 *)&(this_00->impl_).data_ = local_50._0_4_;
    (this->m_target).impl_.data_.v4.sin_addr.s_addr = local_50._4_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 8) = local_50._8_4_;
    *(undefined4 *)((long)&(this->m_target).impl_.data_ + 0xc) = local_50._12_4_;
    if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
      cVar10 = (**(code **)(*(_func_int **)local_78._0_8_ + 0x30))();
      if (cVar10 != '\0') {
        pcVar6 = (this->m_hostname)._M_dataplus._M_p;
        print_endpoint_abi_cxx11_((string *)local_b8,(aux *)this_00,ep_00);
        (**(code **)(*(_func_int **)local_78._0_8_ + 0x38))
                  (local_78._0_8_,"*** UDP_TRACKER trying next IP [ host: \"%s\" ip: \"%s\" ]",
                   pcVar6,local_b8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._0_8_ != aaStack_a8) {
          operator_delete((void *)local_b8._0_8_,aaStack_a8[0]._M_allocated_capacity + 1);
        }
      }
    }
    boost::asio::execution::
    any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
    ::any_executor((any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
                    *)local_b8,
                   &(this->super_tracker_connection).super_timeout_handler.m_timeout.impl_.executor_
                  );
    shared_from_this((udp_tracker_connection *)(local_78 + 0x10));
    local_50._0_8_ = start_announce;
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50._16_8_ = local_78._16_8_;
    local_50._24_8_ = p_Stack_60;
    local_78._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::asio::
    post<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,std::_Bind<void(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>))()>>
              ((any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
                *)local_b8,
               (_Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>))()>
                *)local_50,(type *)0x0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_);
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
    (**(code **)aaStack_a8[0]._0_8_)();
    psVar7 = ((this->super_tracker_connection).m_man)->m_settings;
    pmVar1 = &psVar7->m_mutex;
    local_b8._0_8_ = pmVar1;
    if ((this->super_tracker_connection).m_req.event == stopped) {
      local_b8._8_8_ = (ulong)(uint7)local_b8._9_7_ << 8;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b8);
      completion_timeout = (psVar7->m_store).m_ints._M_elems[2];
    }
    else {
      local_b8._8_8_ = (ulong)(uint7)local_b8._9_7_ << 8;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b8);
      completion_timeout = (psVar7->m_store).m_ints._M_elems[0];
    }
    local_b8[8] = '\x01';
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b8);
    local_b8[8] = '\0';
    local_b8._0_8_ = pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b8);
    local_b8[8] = 1;
    read_timeout = (psVar7->m_store).m_ints._M_elems[1];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b8);
    timeout_handler::set_timeout((timeout_handler *)this,completion_timeout,read_timeout);
    if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  return;
}

Assistant:

void udp_tracker_connection::fail(error_code const& ec, operation_t const op
		, char const* msg, seconds32 const interval, seconds32 const min_interval)
	{
		// m_target failed. remove it from the endpoint list
		auto const i = std::find(m_endpoints.begin()
			, m_endpoints.end(), make_tcp(m_target));

		if (i != m_endpoints.end()) m_endpoints.erase(i);

		// if that was the last one, or the listen socket was closed
		// fail the whole announce
		if (m_endpoints.empty() || !tracker_req().outgoing_socket)
		{
			tracker_connection::fail(ec, op, msg, interval, min_interval);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb && cb->should_log())
		{
			cb->debug_log(R"(*** UDP_TRACKER [ host: "%s" ip: "%s" | ERROR: "%s" ])"
				, m_hostname.c_str(), print_endpoint(m_target).c_str(), ec.message().c_str());
		}
#endif

		// pick another target endpoint and try again
		m_target = make_udp(m_endpoints.front());

#ifndef TORRENT_DISABLE_LOGGING
		if (cb && cb->should_log())
		{
			cb->debug_log(R"(*** UDP_TRACKER trying next IP [ host: "%s" ip: "%s" ])"
				, m_hostname.c_str(), print_endpoint(m_target).c_str());
		}
#endif
		post(get_executor(), std::bind(
			&udp_tracker_connection::start_announce, shared_from_this()));

		aux::session_settings const& settings = m_man.settings();
		set_timeout(tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout)
			, settings.get_int(settings_pack::tracker_receive_timeout));
	}